

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O2

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QLatin1StringView str)

{
  bool bVar1;
  char *pcVar2;
  char *in_RCX;
  QtPrivate *this_00;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView in;
  QVarLengthArray<char,_256LL> utf8;
  QVarLengthArray<char,_256LL> local_140;
  long local_28;
  
  s.m_data = str.m_data;
  this_00 = (QtPrivate *)str.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  s.m_size = (qsizetype)s.m_data;
  bVar1 = QtPrivate::isAscii(this_00,s);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      appendTextString(this,s.m_data,(qsizetype)this_00);
      return;
    }
  }
  else {
    memset(&local_140,0xaa,0x118);
    QVarLengthArray<char,_256LL>::QVarLengthArray(&local_140,(long)this_00 * 2);
    in.m_data = in_RCX;
    in.m_size = (qsizetype)s.m_data;
    pcVar2 = QUtf8::convertFromLatin1
                       ((QUtf8 *)local_140.super_QVLABase<char>.super_QVLABaseBase.ptr,
                        (char *)this_00,in);
    appendTextString(this,(char *)local_140.super_QVLABase<char>.super_QVLABaseBase.ptr,
                     (long)pcVar2 - (long)local_140.super_QVLABase<char>.super_QVLABaseBase.ptr);
    QVarLengthArray<char,_256LL>::~QVarLengthArray(&local_140);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(QLatin1StringView str)
{
    // We've got Latin-1 but CBOR wants UTF-8, so check if the string is the
    // common subset (US-ASCII).
    if (QtPrivate::isAscii(str)) {
        // it is plain US-ASCII
        appendTextString(str.latin1(), str.size());
    } else {
        // non-ASCII, convert:
        QVarLengthArray<char> utf8(str.size() * 2); // each L1 char gives at most two U8 units
        const qsizetype written = QUtf8::convertFromLatin1(utf8.data(), str) - utf8.data();
        appendTextString(utf8.data(), written);
    }
}